

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O1

bool __thiscall LiteScript::Namespace::DefineVariable(Namespace *this,char *name)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  allocator local_89;
  undefined1 local_88 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>
  local_58;
  
  uVar3 = ((long)(this->vars).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->vars).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
  bVar4 = (int)uVar3 == 0;
  if (!bVar4) {
    iVar1 = std::__cxx11::string::compare
                      ((char *)(this->vars).
                               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
    if (iVar1 != 0) {
      uVar3 = uVar3 & 0xffffffff;
      uVar2 = 0;
      do {
        uVar2 = uVar2 + 1;
        bVar4 = uVar3 <= uVar2;
        if (uVar2 == uVar3) goto LAB_0013f953;
        iVar1 = std::__cxx11::string::compare
                          ((char *)((this->vars).
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + uVar2));
      } while (iVar1 != 0);
      bVar4 = uVar3 <= uVar2;
    }
    if (bVar4 == false) {
      return false;
    }
  }
LAB_0013f953:
  std::__cxx11::string::string((string *)(local_88 + 0x10),name,&local_89);
  Memory::Create((Memory *)local_88,(Type *)this->memory);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable,_true>
            (&local_58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_88 + 0x10),
             (Variable *)local_88);
  std::
  vector<std::pair<std::__cxx11::string,LiteScript::Variable>,std::allocator<std::pair<std::__cxx11::string,LiteScript::Variable>>>
  ::emplace_back<std::pair<std::__cxx11::string,LiteScript::Variable>>
            ((vector<std::pair<std::__cxx11::string,LiteScript::Variable>,std::allocator<std::pair<std::__cxx11::string,LiteScript::Variable>>>
              *)this,&local_58);
  Variable::~Variable(&local_58.second);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.first._M_dataplus._M_p != &local_58.first.field_2) {
    operator_delete(local_58.first._M_dataplus._M_p);
  }
  Variable::~Variable((Variable *)local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  return bVar4;
}

Assistant:

bool LiteScript::Namespace::DefineVariable(const char *name) {
    for (unsigned int i = 0, sz = this->vars.size(); i < sz; i++) {
        if (this->vars[i].first == name)
            return false;
    }
    this->vars.push_back({ std::string(name), this->memory.Create(Type::NIL) });
    return true;
}